

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olcPixelGameEngine.h
# Opt level: O2

void __thiscall
olc::PixelGameEngine::DrawPartialRotatedDecal
          (PixelGameEngine *this,vf2d *pos,Decal *decal,float fAngle,vf2d *center,vf2d *source_pos,
          vf2d *source_size,vf2d *scale,Pixel *tint)

{
  uint32_t uVar1;
  int i;
  long lVar2;
  v2d_generic<float> vVar3;
  v2d_generic<float> vVar4;
  v2d_generic<float> vVar5;
  double dVar6;
  double dVar7;
  v2d_generic<float> vVar8;
  float fVar9;
  float fVar10;
  v2d_generic<float> vVar11;
  float fVar13;
  v2d_generic<float> vVar12;
  undefined8 local_c8;
  undefined8 uStack_c0;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float local_ac;
  undefined1 local_a0 [8];
  undefined1 local_98 [24];
  vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>> avStack_80 [8];
  undefined1 local_78 [16];
  vector<float,std::allocator<float>> local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  DecalMode local_38;
  uint32_t uStack_34;
  
  local_98._0_16_ = ZEXT416(0);
  local_38 = NORMAL;
  uStack_34 = 4;
  uVar1 = (tint->field_0).n;
  local_c8 = CONCAT44(uVar1,uVar1);
  uStack_c0 = CONCAT44(uVar1,uVar1);
  local_a0 = (undefined1  [8])decal;
  unique0x100003b5 = local_98._0_16_;
  local_78 = local_98._0_16_;
  local_68 = (vector<float,std::allocator<float>>  [16])local_98._0_16_;
  local_58 = local_98._0_16_;
  local_48 = local_98._0_16_;
  std::vector<olc::Pixel,std::allocator<olc::Pixel>>::_M_assign_aux<olc::Pixel_const*>
            ((vector<olc::Pixel,std::allocator<olc::Pixel>> *)(local_58 + 8),&local_c8);
  local_c8 = 0x3f8000003f800000;
  uStack_c0 = 0x3f8000003f800000;
  std::vector<float,std::allocator<float>>::_M_assign_aux<float_const*>(local_68,&local_c8);
  std::vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_>::resize
            ((vector<olc::v2d_generic<float>,_std::allocator<olc::v2d_generic<float>_>_> *)local_98,
             4);
  vVar3.x = (*scale).x * (0.0 - (*center).x);
  vVar3.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)local_98._0_8_ = vVar3;
  vVar4.x = (*scale).x * (0.0 - (*center).x);
  vVar4.y = (*scale).y * (source_size->y - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 8) = vVar4;
  vVar8.x = (*scale).x * ((*source_size).x - (*center).x);
  vVar8.y = (*scale).y * ((*source_size).y - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 0x10) = vVar8;
  vVar5.x = (*scale).x * (source_size->x - (*center).x);
  vVar5.y = (*scale).y * (0.0 - (*center).y);
  *(v2d_generic<float> *)(local_98._0_8_ + 0x18) = vVar5;
  dVar6 = cos((double)fAngle);
  dVar7 = sin((double)fAngle);
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    vVar11.x = (*pos).x +
               ((pointer)(local_98._0_8_ + lVar2 * 8))->x * (float)dVar6 +
               -((pointer)(local_98._0_8_ + lVar2 * 8))->y * (float)dVar7;
    vVar11.y = (*pos).y +
               ((pointer)(local_98._0_8_ + lVar2 * 8))->x * (float)dVar7 +
               ((pointer)(local_98._0_8_ + lVar2 * 8))->y * (float)dVar6;
    *(v2d_generic<float> *)(local_98._0_8_ + lVar2 * 8) = vVar11;
    fVar10 = (this->vInvScreenSize).x * (*(pointer)(local_98._0_8_ + lVar2 * 8)).x;
    fVar13 = (this->vInvScreenSize).y * (*(pointer)(local_98._0_8_ + lVar2 * 8)).y;
    vVar12.x = fVar10 + fVar10 + -1.0;
    vVar12.y = fVar13 + fVar13 + -1.0;
    *(v2d_generic<float> *)(local_98._0_8_ + lVar2 * 8) = vVar12;
    ((pointer)(local_98._0_8_ + lVar2 * 8))->y = -((pointer)(local_98._0_8_ + lVar2 * 8))->y;
  }
  fVar13 = (decal->vUVScale).x;
  fVar10 = (*source_pos).x * fVar13;
  fVar9 = (decal->vUVScale).y;
  local_ac = (*source_pos).y * fVar9;
  local_c8 = CONCAT44(local_ac,fVar10);
  local_b8 = (*source_size).x * fVar13 + fVar10;
  fStack_b4 = (*source_size).y * fVar9 + local_ac;
  uStack_c0 = CONCAT44(fStack_b4,fVar10);
  fStack_b0 = local_b8;
  std::vector<olc::v2d_generic<float>,std::allocator<olc::v2d_generic<float>>>::
  _M_assign_aux<olc::v2d_generic<float>const*>(avStack_80,&local_c8);
  local_38 = this->nDecalMode;
  std::vector<olc::DecalInstance,_std::allocator<olc::DecalInstance>_>::push_back
            (&(this->vLayers).super__Vector_base<olc::LayerDesc,_std::allocator<olc::LayerDesc>_>.
              _M_impl.super__Vector_impl_data._M_start[this->nTargetLayer].vecDecalInstance,
             (value_type *)local_a0);
  DecalInstance::~DecalInstance((DecalInstance *)local_a0);
  return;
}

Assistant:

void PixelGameEngine::DrawPartialRotatedDecal(const olc::vf2d &pos, olc::Decal *decal, const float fAngle, const olc::vf2d &center, const olc::vf2d &source_pos, const olc::vf2d &source_size, const olc::vf2d &scale, const olc::Pixel &tint)
	{
		DecalInstance di;
		di.decal = decal;
		di.points = 4;
		di.tint = {tint, tint, tint, tint};
		di.w = {1, 1, 1, 1};
		di.pos.resize(4);
		di.pos[0] = (olc::vf2d(0.0f, 0.0f) - center) * scale;
		di.pos[1] = (olc::vf2d(0.0f, source_size.y) - center) * scale;
		di.pos[2] = (olc::vf2d(source_size.x, source_size.y) - center) * scale;
		di.pos[3] = (olc::vf2d(source_size.x, 0.0f) - center) * scale;
		float c = cos(fAngle), s = sin(fAngle);
		for (int i = 0; i < 4; i++)
		{
			di.pos[i] = pos + olc::vf2d(di.pos[i].x * c - di.pos[i].y * s, di.pos[i].x * s + di.pos[i].y * c);
			di.pos[i] = di.pos[i] * vInvScreenSize * 2.0f - olc::vf2d(1.0f, 1.0f);
			di.pos[i].y *= -1.0f;
		}

		olc::vf2d uvtl = source_pos * decal->vUVScale;
		olc::vf2d uvbr = uvtl + (source_size * decal->vUVScale);
		di.uv = {{uvtl.x, uvtl.y}, {uvtl.x, uvbr.y}, {uvbr.x, uvbr.y}, {uvbr.x, uvtl.y}};
		di.mode = nDecalMode;
		vLayers[nTargetLayer].vecDecalInstance.push_back(di);
	}